

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLoadXYZROTnodeBodyBushingMate::ChLoadXYZROTnodeBodyBushingMate
          (ChLoadXYZROTnodeBodyBushingMate *this,shared_ptr<chrono::fea::ChNodeFEAxyzrot> *mnodeA,
          shared_ptr<chrono::ChBody> *mbodyB,ChFrame<double> *abs_application,
          ChVector<double> *mstiffness,ChVector<double> *mdamping,ChVector<double> *mrotstiffness,
          ChVector<double> *mrotdamping)

{
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,
             &mnodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  ChLoadXYZROTnodeBodyBushingSpherical::ChLoadXYZROTnodeBodyBushingSpherical
            (&this->super_ChLoadXYZROTnodeBodyBushingSpherical,
             (shared_ptr<chrono::fea::ChNodeFEAxyzrot> *)&local_50,
             (shared_ptr<chrono::ChBody> *)&local_40,abs_application,mstiffness,mdamping);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  (this->super_ChLoadXYZROTnodeBodyBushingSpherical).super_ChLoadXYZROTnodeBody.
  super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadXYZROTnodeBody_011774c0;
  (this->rot_stiffness).m_data[0] = mrotstiffness->m_data[0];
  (this->rot_stiffness).m_data[1] = mrotstiffness->m_data[1];
  (this->rot_stiffness).m_data[2] = mrotstiffness->m_data[2];
  (this->rot_damping).m_data[0] = mrotdamping->m_data[0];
  (this->rot_damping).m_data[1] = mrotdamping->m_data[1];
  (this->rot_damping).m_data[2] = mrotdamping->m_data[2];
  return;
}

Assistant:

ChLoadXYZROTnodeBodyBushingMate::ChLoadXYZROTnodeBodyBushingMate(std::shared_ptr<ChNodeFEAxyzrot> mnodeA,
                                                                 std::shared_ptr<ChBody> mbodyB,
                                                                 const ChFrame<>& abs_application,
                                                                 const ChVector<>& mstiffness,
                                                                 const ChVector<>& mdamping,
                                                                 const ChVector<>& mrotstiffness,
                                                                 const ChVector<>& mrotdamping)
    : ChLoadXYZROTnodeBodyBushingSpherical(mnodeA, mbodyB, abs_application, mstiffness, mdamping),
      rot_stiffness(mrotstiffness),
      rot_damping(mrotdamping) {}